

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O3

void __thiscall
slang::analysis::AnalysisManager::analyzeScopeAsync(AnalysisManager *this,Scope *scope)

{
  atomic<unsigned_long> *paVar1;
  insert_counter_type *piVar2;
  mutex *__mutex;
  __int_type _Var3;
  __int_type_conflict1 _Var4;
  __int_type _Var5;
  uint uVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  ulong uVar9;
  group_type_pointer pgVar10;
  _Map_pointer ppfVar11;
  undefined1 auVar12 [16];
  ushort uVar13;
  __int_type_conflict _Var14;
  __int_type_conflict _Var15;
  __int_type_conflict _Var16;
  __int_type_conflict _Var17;
  int iVar18;
  function<void_()> *pfVar19;
  _Elt_pointer pfVar20;
  uint k;
  uint uVar21;
  uint uVar22;
  group_access_pointer pgVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long in_FS_OFFSET;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  group_type_pointer local_b0;
  __int_type_conflict local_a8;
  undefined8 local_a0;
  
  uVar29 = (ulong)((this->analyzedScopes).table_.mutexes.mutexes.buf + 0x3f) & 0xffffffffffffffc0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = scope;
  uVar26 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
  local_a0 = scope;
LAB_00376906:
  if (*(char *)(in_FS_OFFSET + -0x10) == '\0') {
    LOCK();
    UNLOCK();
    uVar24 = (ulong)((int)boost::unordered::detail::foa::
                          concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
                          ::thread_counter + 1U & 0x7f);
    boost::unordered::detail::foa::
    concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
    ::thread_counter =
         boost::unordered::detail::foa::
         concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
         ::thread_counter + 1;
    *(ulong *)(in_FS_OFFSET + -0x18) = uVar24;
    *(undefined1 *)(in_FS_OFFSET + -0x10) = 1;
  }
  else {
    uVar24 = *(ulong *)(in_FS_OFFSET + -0x18);
  }
  lVar30 = uVar24 * 0x40;
  uVar21 = 0;
  do {
    uVar22 = *(uint *)(lVar30 + uVar29);
    if (uVar22 < 0x3fffffff) {
      LOCK();
      bVar31 = uVar22 == *(uint *)(lVar30 + uVar29);
      if (bVar31) {
        *(uint *)(lVar30 + uVar29) = uVar22 + 1;
      }
      UNLOCK();
      if (bVar31) break;
    }
    boost::unordered::detail::foa::rw_spinlock::yield(uVar21);
    uVar21 = uVar21 + 1;
  } while( true );
  uVar24 = uVar26 >> ((byte)(this->analyzedScopes).table_.
                            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .arrays.
                            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .groups_size_index & 0x3f);
  lVar27 = (uVar26 & 0xff) * 4;
  _Var14 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar27 + 0xc];
  _Var15 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar27 + 0xd];
  _Var16 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar27 + 0xe];
  _Var17 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar27 + 0xf];
  local_a0 = (Scope *)CONCAT17(_Var17,CONCAT16(_Var16,CONCAT15(_Var15,CONCAT14(_Var14,(undefined4)
                                                                                      local_a0))));
LAB_00376989:
  _Var5 = (this->analyzedScopes).table_.
          super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          .arrays.group_accesses_[uVar24].cnt.super___atomic_base<unsigned_int>._M_i;
  uVar25 = 0;
  uVar28 = uVar24;
LAB_0037699b:
  pgVar7 = (this->analyzedScopes).table_.
           super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .arrays.
           super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .groups_;
  pgVar10 = pgVar7 + uVar28;
  auVar32[0] = -(pgVar10->m[0].n.super___atomic_base<unsigned_char>._M_i == _Var14);
  auVar32[1] = -(pgVar10->m[1].n.super___atomic_base<unsigned_char>._M_i == _Var15);
  auVar32[2] = -(pgVar10->m[2].n.super___atomic_base<unsigned_char>._M_i == _Var16);
  auVar32[3] = -(pgVar10->m[3].n.super___atomic_base<unsigned_char>._M_i == _Var17);
  auVar32[4] = -(pgVar10->m[4].n.super___atomic_base<unsigned_char>._M_i == _Var14);
  auVar32[5] = -(pgVar10->m[5].n.super___atomic_base<unsigned_char>._M_i == _Var15);
  auVar32[6] = -(pgVar10->m[6].n.super___atomic_base<unsigned_char>._M_i == _Var16);
  auVar32[7] = -(pgVar10->m[7].n.super___atomic_base<unsigned_char>._M_i == _Var17);
  auVar32[8] = -(pgVar10->m[8].n.super___atomic_base<unsigned_char>._M_i == _Var14);
  auVar32[9] = -(pgVar10->m[9].n.super___atomic_base<unsigned_char>._M_i == _Var15);
  auVar32[10] = -(pgVar10->m[10].n.super___atomic_base<unsigned_char>._M_i == _Var16);
  auVar32[0xb] = -(pgVar10->m[0xb].n.super___atomic_base<unsigned_char>._M_i == _Var17);
  auVar32[0xc] = -(pgVar10->m[0xc].n.super___atomic_base<unsigned_char>._M_i == _Var14);
  auVar32[0xd] = -(pgVar10->m[0xd].n.super___atomic_base<unsigned_char>._M_i == _Var15);
  auVar32[0xe] = -(pgVar10->m[0xe].n.super___atomic_base<unsigned_char>._M_i == _Var16);
  auVar32[0xf] = -(pgVar10->m[0xf].n.super___atomic_base<unsigned_char>._M_i == _Var17);
  uVar21 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
  if (uVar21 != 0) {
    ppVar8 = (this->analyzedScopes).table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .arrays.
             super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .elements_;
    pgVar23 = (this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .arrays.group_accesses_;
    uVar22 = 0;
    do {
      uVar6 = pgVar23[uVar28].m.state_.super___atomic_base<unsigned_int>._M_i;
      if (uVar6 < 0x3fffffff) {
        LOCK();
        bVar31 = uVar6 == pgVar23[uVar28].m.state_.super___atomic_base<unsigned_int>._M_i;
        if (bVar31) {
          pgVar23[uVar28].m.state_.super___atomic_base<unsigned_int>._M_i = uVar6 + 1;
        }
        UNLOCK();
        if (bVar31) goto LAB_00376a1d;
      }
      boost::unordered::detail::foa::rw_spinlock::yield(uVar22);
      uVar22 = uVar22 + 1;
    } while( true );
  }
  goto LAB_00376a66;
LAB_00376a1d:
  do {
    uVar22 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
      }
    }
    if ((pgVar7[uVar28].m[uVar22].n.super___atomic_base<unsigned_char>._M_i != '\0') &&
       (ppVar8[uVar28 * 0xf + (ulong)uVar22].first == local_a0)) {
      LOCK();
      pgVar23[uVar28].m.state_.super___atomic_base<unsigned_int>._M_i =
           pgVar23[uVar28].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
      LOCK();
      *(int *)(lVar30 + uVar29) = *(int *)(lVar30 + uVar29) + -1;
      UNLOCK();
      return;
    }
    uVar21 = uVar21 - 1 & uVar21;
  } while (uVar21 != 0);
  LOCK();
  pgVar23[uVar28].m.state_.super___atomic_base<unsigned_int>._M_i =
       pgVar23[uVar28].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
LAB_00376a66:
  if ((*(byte *)((long)&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::atomic_integral>::
                        is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar26 & 7)) &
      pgVar7[uVar28].m[0xf].n.super___atomic_base<unsigned_char>._M_i) == 0) goto LAB_00376a93;
  uVar9 = (this->analyzedScopes).table_.
          super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          .arrays.
          super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          .groups_size_mask;
  lVar27 = uVar28 + uVar25;
  uVar25 = uVar25 + 1;
  uVar28 = lVar27 + 1U & uVar9;
  if (uVar9 < uVar25) goto LAB_00376a93;
  goto LAB_0037699b;
LAB_00376a93:
  LOCK();
  paVar1 = &(this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .size_ctrl.size;
  _Var4 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if ((this->analyzedScopes).table_.
      super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
      .size_ctrl.ml.super___atomic_base<unsigned_long>._M_i < _Var4 + 1) goto LAB_00376c1c;
  pgVar10 = (this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .arrays.
            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .groups_;
  local_b0 = pgVar10 + uVar24;
  pgVar23 = (this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .arrays.group_accesses_ + uVar24;
  boost::unordered::detail::foa::rw_spinlock::lock(&pgVar23->m);
  pgVar10 = pgVar10 + uVar24;
  auVar33[0] = -(pgVar10->m[0].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[1] = -(pgVar10->m[1].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[2] = -(pgVar10->m[2].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[3] = -(pgVar10->m[3].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[4] = -(pgVar10->m[4].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[5] = -(pgVar10->m[5].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[6] = -(pgVar10->m[6].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[7] = -(pgVar10->m[7].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[8] = -(pgVar10->m[8].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[9] = -(pgVar10->m[9].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[10] = -(pgVar10->m[10].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[0xb] = -(pgVar10->m[0xb].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[0xc] = -(pgVar10->m[0xc].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[0xd] = -(pgVar10->m[0xd].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[0xe] = -(pgVar10->m[0xe].n.super___atomic_base<unsigned_char>._M_i == '\0');
  auVar33[0xf] = -(pgVar10->m[0xf].n.super___atomic_base<unsigned_char>._M_i == '\0');
  uVar21 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
  uVar28 = uVar24;
  if (uVar21 == 0) {
    lVar27 = 1;
    do {
      LOCK();
      local_b0->m[0xf].n.super___atomic_base<unsigned_char>._M_i =
           local_b0->m[0xf].n.super___atomic_base<unsigned_char>._M_i | '\x01' << ((byte)uVar26 & 7)
      ;
      UNLOCK();
      (pgVar23->m).state_.super___atomic_base<unsigned_int>._M_i = 0;
      uVar28 = uVar28 + lVar27 &
               (this->analyzedScopes).table_.
               super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .arrays.
               super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .groups_size_mask;
      pgVar10 = (this->analyzedScopes).table_.
                super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                .arrays.
                super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                .groups_;
      local_b0 = pgVar10 + uVar28;
      pgVar23 = (this->analyzedScopes).table_.
                super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                .arrays.group_accesses_ + uVar28;
      boost::unordered::detail::foa::rw_spinlock::lock(&pgVar23->m);
      pgVar10 = pgVar10 + uVar28;
      auVar34[0] = -(pgVar10->m[0].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[1] = -(pgVar10->m[1].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[2] = -(pgVar10->m[2].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[3] = -(pgVar10->m[3].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[4] = -(pgVar10->m[4].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[5] = -(pgVar10->m[5].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[6] = -(pgVar10->m[6].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[7] = -(pgVar10->m[7].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[8] = -(pgVar10->m[8].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[9] = -(pgVar10->m[9].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[10] = -(pgVar10->m[10].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[0xb] = -(pgVar10->m[0xb].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[0xc] = -(pgVar10->m[0xc].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[0xd] = -(pgVar10->m[0xd].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[0xe] = -(pgVar10->m[0xe].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar34[0xf] = -(pgVar10->m[0xf].n.super___atomic_base<unsigned_char>._M_i == '\0');
      uVar13 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe;
      uVar21 = (uint)uVar13;
      lVar27 = lVar27 + 1;
    } while (uVar13 == 0);
  }
  uVar22 = 0;
  if (uVar21 != 0) {
    for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
    }
  }
  uVar25 = (ulong)uVar22;
  local_b0->m[uVar25].n.super___atomic_base<unsigned_char>._M_i = local_a8;
  LOCK();
  piVar2 = &(this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .arrays.group_accesses_[uVar24].cnt;
  _Var3 = (piVar2->super___atomic_base<unsigned_int>)._M_i;
  (piVar2->super___atomic_base<unsigned_int>)._M_i =
       (piVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (_Var3 == _Var5) {
    ppVar8 = (this->analyzedScopes).table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .arrays.
             super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .elements_;
    ppVar8[uVar28 * 0xf + uVar25].first = local_a0;
    ppVar8[uVar28 * 0xf + uVar25].second.
    super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>._M_engaged = false;
    (pgVar23->m).state_.super___atomic_base<unsigned_int>._M_i = 0;
    LOCK();
    *(int *)(lVar30 + uVar29) = *(int *)(lVar30 + uVar29) + -1;
    UNLOCK();
    __mutex = &(this->threadPool).tasks_mutex;
    iVar18 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar18 != 0) {
      std::__throw_system_error(iVar18);
    }
    pfVar20 = (this->threadPool).tasks.c.
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pfVar20 ==
        *(_Elt_pointer *)
         ((long)&(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
      ppfVar11 = *(_Map_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 0x18);
      if (((long)*(_Elt_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_start + 0x10) -
           (long)(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
          ((long)pfVar20 -
           (long)*(_Elt_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 8) >> 5) +
          ((((ulong)((long)ppfVar11 -
                    (long)*(_Map_pointer *)
                           ((long)&(this->threadPool).tasks.c.
                                   super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
          (ulong)(ppfVar11 == (_Map_pointer)0x0)) * 0x10 == 0x7ffffffffffffff) {
        std::__throw_length_error("cannot create std::deque larger than max_size()");
      }
      if ((this->threadPool).tasks.c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_map_size -
          ((long)ppfVar11 -
           (long)(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_map >> 3) < 2) {
        std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_reallocate_map(&(this->threadPool).tasks.c,1,false);
      }
      pfVar19 = (function<void_()> *)operator_new(0x200);
      (*(_Map_pointer *)
        ((long)&(this->threadPool).tasks.c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish + 0x18))[1] = pfVar19;
      pfVar20 = (this->threadPool).tasks.c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      *(AnalysisManager **)&(pfVar20->super__Function_base)._M_functor = this;
      *(Scope **)((long)&(pfVar20->super__Function_base)._M_functor + 8) = local_a0;
      pfVar20->_M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_invoke;
      (pfVar20->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_manager;
      ppfVar11 = *(_Map_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 0x18);
      *(_Map_pointer *)
       ((long)&(this->threadPool).tasks.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_finish + 0x18) = ppfVar11 + 1;
      pfVar20 = ppfVar11[1];
      *(_Elt_pointer *)
       ((long)&(this->threadPool).tasks.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_finish + 8) = pfVar20;
      *(_Elt_pointer *)
       ((long)&(this->threadPool).tasks.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_finish + 0x10) = pfVar20 + 0x10;
    }
    else {
      *(AnalysisManager **)&(pfVar20->super__Function_base)._M_functor = this;
      *(Scope **)((long)&(pfVar20->super__Function_base)._M_functor + 8) = local_a0;
      pfVar20->_M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_invoke;
      (pfVar20->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_manager;
      pfVar20 = (this->threadPool).tasks.c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    (this->threadPool).tasks.c.
    super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = pfVar20;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::_V2::condition_variable_any::notify_one(&(this->threadPool).task_available_cv);
    return;
  }
  local_b0->m[uVar25].n.super___atomic_base<unsigned_char>._M_i = '\0';
  (pgVar23->m).state_.super___atomic_base<unsigned_int>._M_i = 0;
  LOCK();
  paVar1 = &(this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .size_ctrl.size;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  goto LAB_00376989;
LAB_00376c1c:
  LOCK();
  paVar1 = &(this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .size_ctrl.size;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  LOCK();
  *(int *)(lVar30 + uVar29) = *(int *)(lVar30 + uVar29) + -1;
  UNLOCK();
  boost::unordered::detail::foa::
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::rehash_if_full(&(this->analyzedScopes).table_);
  goto LAB_00376906;
}

Assistant:

void AnalysisManager::analyzeScopeAsync(const Scope& scope) {
    // Kick off a new analysis task if we haven't already seen
    // this scope before.
    if (analyzedScopes.try_emplace(&scope, std::nullopt)) {
        threadPool.detach_task([this, &scope] {
            SLANG_TRY {
                auto& result = analyzeScopeBlocking(scope);
                analyzedScopes.visit(&scope, [&result](auto& item) { item.second = &result; });
            }
            SLANG_CATCH(...) {
                std::unique_lock<std::mutex> lock(mutex);
                pendingException = std::current_exception();
            }
        });
    }